

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_Bech32.cpp
# Opt level: O0

void __thiscall
Bech32Test_decode_good_Test::~Bech32Test_decode_good_Test(Bech32Test_decode_good_Test *this)

{
  Bech32Test_decode_good_Test *this_local;
  
  ~Bech32Test_decode_good_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(Bech32Test, decode_good) {
    std::string data("a1lqfn3a");
    bech32::DecodedResult b = bech32::decode(data);
    ASSERT_EQ(b.encoding, bech32::Encoding::Bech32m);
    ASSERT_EQ(b.hrp, "a");
    ASSERT_TRUE(b.dp.empty());

    data = "A1LQFN3A";
    b = bech32::decode(data);
    ASSERT_EQ(b.encoding, bech32::Encoding::Bech32m);
    ASSERT_EQ(b.hrp, "a");
    ASSERT_TRUE(b.dp.empty());

    data = "abcdef1l7aum6echk45nj3s0wdvt2fg8x9yrzpqzd3ryx";
    b = bech32::decode(data);
    ASSERT_EQ(b.encoding, bech32::Encoding::Bech32m);
    ASSERT_EQ(b.hrp, "abcdef");
    ASSERT_EQ(b.dp.size(), 32);
    ASSERT_EQ(b.dp[0], '\x1f'); // first 'l' in above dp part
    ASSERT_EQ(b.dp[31], '\0');  // last 'q' in above dp part
}